

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O3

bool __thiscall tcmalloc::PageHeap::DecommitSpan(PageHeap *this,Span *span)

{
  uint64_t *puVar1;
  Length LVar2;
  bool bVar3;
  
  puVar1 = &(this->stats_).decommit_count;
  *puVar1 = *puVar1 + 1;
  bVar3 = TCMalloc_SystemRelease((void *)(span->start << 0xd),span->length << 0xd);
  if (bVar3) {
    LVar2 = span->length;
    puVar1 = &(this->stats_).committed_bytes;
    *puVar1 = *puVar1 + LVar2 * -0x2000;
    puVar1 = &(this->stats_).total_decommit_bytes;
    *puVar1 = *puVar1 + LVar2 * 0x2000;
  }
  return bVar3;
}

Assistant:

bool PageHeap::DecommitSpan(Span* span) {
  ++stats_.decommit_count;

  bool rv = TCMalloc_SystemRelease(reinterpret_cast<void*>(span->start << kPageShift),
                                   static_cast<size_t>(span->length << kPageShift));
  if (rv) {
    stats_.committed_bytes -= span->length << kPageShift;
    stats_.total_decommit_bytes += (span->length << kPageShift);
  }

  return rv;
}